

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_tt_GetGlyphBitmapBoxSubpixel
               (nk_tt_fontinfo *font,int glyph,float scale_x,float scale_y,float shift_x,
               float shift_y,int *ix0,int *iy0,int *ix1,int *iy1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uchar *puVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  
  uVar7 = nk_tt__GetGlyfOffset(font,glyph);
  if ((int)uVar7 < 0) {
    if (ix0 != (int *)0x0) {
      *ix0 = 0;
    }
    if (iy0 != (int *)0x0) {
      *iy0 = 0;
    }
    if (ix1 != (int *)0x0) {
      *ix1 = 0;
    }
    iVar8 = 0;
    if (iy1 == (int *)0x0) {
      return;
    }
  }
  else {
    puVar6 = font->data;
    bVar1 = puVar6[(ulong)uVar7 + 5];
    bVar2 = puVar6[(ulong)uVar7 + 4];
    uVar5 = *(ushort *)(puVar6 + (ulong)uVar7 + 6);
    bVar3 = puVar6[(ulong)uVar7 + 9];
    bVar4 = puVar6[(ulong)uVar7 + 8];
    if (ix0 != (int *)0x0) {
      fVar9 = (float)(int)(short)(*(ushort *)(puVar6 + (ulong)uVar7 + 2) << 8 |
                                 *(ushort *)(puVar6 + (ulong)uVar7 + 2) >> 8) * scale_x + 0.0;
      *ix0 = (int)(float)(int)((int)fVar9 - (uint)(fVar9 < 0.0));
    }
    if (iy0 != (int *)0x0) {
      fVar9 = (float)(int)-((int)(short)((ushort)bVar4 << 8) | (uint)bVar3) * scale_y + 0.0;
      *iy0 = (int)(float)(int)((int)fVar9 - (uint)(fVar9 < 0.0));
    }
    if (ix1 != (int *)0x0) {
      fVar9 = (float)(int)(short)(uVar5 << 8 | uVar5 >> 8) * scale_x + 0.0;
      *ix1 = (int)fVar9 + (uint)(fVar9 < 0.0 && (float)(int)fVar9 < fVar9);
    }
    if (iy1 == (int *)0x0) {
      return;
    }
    fVar9 = (float)(int)-((int)(short)((ushort)bVar2 << 8) | (uint)bVar1) * scale_y + 0.0;
    iVar8 = (int)fVar9 + (uint)(fVar9 < 0.0 && (float)(int)fVar9 < fVar9);
  }
  *iy1 = iVar8;
  return;
}

Assistant:

NK_INTERN void
nk_tt_GetGlyphBitmapBoxSubpixel(const struct nk_tt_fontinfo *font,
    int glyph, float scale_x, float scale_y,float shift_x, float shift_y,
    int *ix0, int *iy0, int *ix1, int *iy1)
{
    int x0,y0,x1,y1;
    if (!nk_tt_GetGlyphBox(font, glyph, &x0,&y0,&x1,&y1)) {
        /* e.g. space character */
        if (ix0) *ix0 = 0;
        if (iy0) *iy0 = 0;
        if (ix1) *ix1 = 0;
        if (iy1) *iy1 = 0;
    } else {
        /* move to integral bboxes (treating pixels as little squares, what pixels get touched)? */
        if (ix0) *ix0 = nk_ifloorf((float)x0 * scale_x + shift_x);
        if (iy0) *iy0 = nk_ifloorf((float)-y1 * scale_y + shift_y);
        if (ix1) *ix1 = nk_iceilf ((float)x1 * scale_x + shift_x);
        if (iy1) *iy1 = nk_iceilf ((float)-y0 * scale_y + shift_y);
    }
}